

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O3

void cdftocsv::doit(bool skipheader)

{
  uint uVar1;
  FILE *pFVar2;
  FILE *__stream;
  int iVar3;
  char *rec;
  undefined8 extraout_RAX;
  int iVar4;
  undefined7 in_register_00000039;
  ulong uVar5;
  long lVar6;
  int stream_type;
  vector<damagebindictionary,_std::allocator<damagebindictionary>_> damagebindictionary_vec;
  uint local_4c;
  vector<damagebindictionary,_std::allocator<damagebindictionary>_> local_48;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    fwrite("event_id,areaperil_id,vulnerability_id,bin_index,prob_to,bin_mean\n",0x42,1,_stdout);
  }
  local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getdamagebindictionary(&local_48);
  iVar4 = ((uint)((int)local_48.
                       super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (int)local_48.
                      super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>.
                      _M_impl.super__Vector_impl_data._M_start) >> 2) * 0x66666668 + 0x10;
  iVar3 = -1;
  if (-1 < iVar4) {
    iVar3 = iVar4;
  }
  uVar5 = 0x13890;
  if (local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl
      .super__Vector_impl_data._M_start) {
    uVar5 = (long)iVar3;
  }
  rec = (char *)operator_new__(uVar5);
  pFVar2 = _stdin;
  local_4c = 0;
  lVar6 = 0;
  do {
    iVar3 = getc(pFVar2);
    if (iVar3 == -1) break;
    *(char *)((long)&local_4c + lVar6) = (char)iVar3;
    lVar6 = lVar6 + 1;
  } while ((int)lVar6 != 4);
  if (local_4c != 1) {
    doit((cdftocsv *)(ulong)local_4c);
    if (pFVar2 != (FILE *)0x0) {
      operator_delete(pFVar2);
    }
    _Unwind_Resume(extraout_RAX);
  }
  do {
    pFVar2 = _stdin;
    lVar6 = 0;
    do {
      iVar3 = getc(pFVar2);
      if (iVar3 == -1) {
        if (local_48.super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
      rec[lVar6] = (char)iVar3;
      __stream = _stdin;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 0xc);
    lVar6 = 0xc;
    do {
      iVar3 = getc(__stream);
      if (iVar3 == -1) break;
      rec[lVar6] = (char)iVar3;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 0x10);
    pFVar2 = _stdin;
    uVar1 = *(uint *)(rec + 0xc);
    if ((uVar1 & 0x1fffffff) != 0) {
      lVar6 = 0;
      do {
        iVar3 = getc(pFVar2);
        if (iVar3 == -1) break;
        rec[lVar6 + 0x10] = (char)iVar3;
        lVar6 = lVar6 + 1;
      } while (uVar1 << 3 != (int)lVar6);
    }
    processrec(rec);
  } while( true );
}

Assistant:

void doit(bool skipheader)
	{

		if (skipheader == false) fprintf(stdout, "event_id,areaperil_id,vulnerability_id,bin_index,prob_to,bin_mean\n");
		std::vector<damagebindictionary> damagebindictionary_vec;
		getdamagebindictionary(damagebindictionary_vec);
		size_t total_bins = damagebindictionary_vec.size();
		if (total_bins == 0) total_bins = 10000;
		int max_recsize = (int)(total_bins * sizeof(prob_mean)) + sizeof(damagecdfrec) + sizeof(int);

		char *rec = new char[max_recsize];
		int stream_type = 0;

		bool bSuccess = getrec((char *)&stream_type, stdin, sizeof(stream_type));

		if (stream_type != 1) {
			fprintf(stderr, "FATAL: Invalid stream type %d expect stream type 1\n", stream_type);
			exit(-1);
		}
		for (;;) {
			char *p = rec;
			bSuccess = getrec(p, stdin, sizeof(damagecdfrec));
			if (bSuccess == false) break;
			p = p + sizeof(damagecdfrec);
			bSuccess = getrec(p, stdin, sizeof(int)); // we now have bin count
			int *q = (int *)p;
			p = p + sizeof(int);
			int recsize = (*q) * sizeof(prob_mean);
			// we should now have damagecdfrec in memory
			bSuccess = getrec(p, stdin, recsize);
			recsize += sizeof(damagecdfrec) + sizeof(int);

			processrec(rec);
		}
	}